

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<const_QTreeWidgetItem_*>::relocate
          (QArrayDataPointer<const_QTreeWidgetItem_*> *this,qsizetype offset,QTreeWidgetItem ***data
          )

{
  bool bVar1;
  long *in_RDX;
  long in_RSI;
  QArrayDataPointer<const_QTreeWidgetItem_*> *in_RDI;
  QTreeWidgetItem ***unaff_retaddr;
  QTreeWidgetItem **res;
  QTreeWidgetItem **first;
  QArrayDataPointer<const_QTreeWidgetItem_*> *c;
  
  first = in_RDI->ptr + in_RSI;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<QTreeWidgetItem_const*,long_long>
            (first,(longlong)in_RDI,(QTreeWidgetItem **)0x92d2f7);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<QTreeWidgetItem_const*>,QTreeWidgetItem_const*const*>
                        (unaff_retaddr,c), bVar1)) {
    *in_RDX = in_RSI * 8 + *in_RDX;
  }
  in_RDI->ptr = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }